

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hpp
# Opt level: O0

Display * lambda::operator<<(Display *display,
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *value)

{
  string *in_RDI;
  Maybe<std::__cxx11::basic_string<char>_> *in_stack_00000028;
  Display *this;
  Display local_58 [40];
  string local_30 [40];
  string *local_8;
  
  this = local_58;
  local_8 = in_RDI;
  std::experimental::fundamentals_v1::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDI);
  show<std::__cxx11::string>(in_stack_00000028);
  Display::operator<<(this,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::experimental::fundamentals_v1::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x18716b);
  return (Display *)local_8;
}

Assistant:

Display &operator<<(Display &display, const T value) {
    display << show(value);
    return display;
}